

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O0

void test_shader_program_compilation
               (GLuint p_shader,vector<unsigned_int,_std::allocator<unsigned_int>_> *p_shaders)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  bool bVar1;
  ostream *poVar2;
  reference __k;
  mapped_type *pmVar3;
  uint *p_iter;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  GLchar info_log [1024];
  int local_1c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_18;
  GLint success;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *p_shaders_local;
  GLuint p_shader_local;
  
  pvStack_18 = p_shaders;
  p_shaders_local._4_4_ = p_shader;
  (*glad_glGetProgramiv)(p_shader,0x8b82,&local_1c);
  if (local_1c == 0) {
    (*glad_glGetProgramInfoLog)(p_shaders_local._4_4_,0x400,(GLsizei *)0x0,(GLchar *)&__range2);
    poVar2 = std::operator<<((ostream *)&std::cerr,"p_shader:");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,p_shaders_local._4_4_);
    poVar2 = std::operator<<(poVar2," shader program compilation failed");
    std::operator<<(poVar2,"\n");
    this = pvStack_18;
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvStack_18);
    p_iter = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  *)&p_iter);
      if (!bVar1) break;
      __k = __gnu_cxx::
            __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator*(&__end2);
      poVar2 = std::operator<<((ostream *)&std::cerr,"id: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*__k);
      std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<((ostream *)&std::cerr,"filepath: ");
      pmVar3 = std::
               unordered_map<unsigned_int,_ShaderFile,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ShaderFile>_>_>
               ::at((unordered_map<unsigned_int,_ShaderFile,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ShaderFile>_>_>
                     *)ShaderDb::file_map,__k);
      poVar2 = std::operator<<(poVar2,(string *)pmVar3);
      std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<((ostream *)&std::cerr,"type: ");
      pmVar3 = std::
               unordered_map<unsigned_int,_ShaderFile,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ShaderFile>_>_>
               ::at((unordered_map<unsigned_int,_ShaderFile,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ShaderFile>_>_>
                     *)ShaderDb::file_map,__k);
      poVar2 = operator<<(poVar2,pmVar3->m_type);
      std::operator<<(poVar2,"\n");
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end2);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,(char *)&__range2);
    std::operator<<(poVar2,"\n");
  }
  return;
}

Assistant:

void test_shader_program_compilation(
    const GLuint p_shader,
    const std::vector<GLuint> &p_shaders) noexcept
{
    static constexpr auto info_log_size = 1024;
    GLint success;
    GLchar info_log[info_log_size];
    glGetProgramiv(p_shader, GL_LINK_STATUS, &success);
    if (!success)
    {
        glGetProgramInfoLog(p_shader, info_log_size, nullptr, info_log);
        std::cerr << "p_shader:" << p_shader << " shader program compilation failed"
                  << "\n";
        for (const auto &p_iter : p_shaders)
        {
            std::cerr << "id: " << p_iter << "\n";
            std::cerr << "filepath: " << ShaderDb::file_map.at(p_iter).m_filepath << "\n";
            std::cerr << "type: " << ShaderDb::file_map.at(p_iter).m_type << "\n";
        }
        std::cout << info_log << "\n";
    }
}